

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O1

uint32_t __thiscall AddressUseTracker::Check(AddressUseTracker *this,uint8_t *addr,size_t len)

{
  uint32_t uVar1;
  ulong in_RAX;
  IPAsKeyLRU *this_00;
  IPAsKeyLRU *pIVar2;
  bool stored;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  this_00 = (IPAsKeyLRU *)operator_new(0x48);
  IPAsKeyLRU::IPAsKeyLRU(this_00,addr,len);
  while (this->table_lru_max <= (this->table).binHash.tableCount) {
    pIVar2 = LruHash<IPAsKeyLRU>::Remove(&this->table,(this->table).LeastRecentlyUsed);
    if (pIVar2 != (IPAsKeyLRU *)0x0) {
      (*(pIVar2->super_IPAsKey)._vptr_IPAsKey[1])(pIVar2);
    }
  }
  uStack_28 = uStack_28 & 0xffffffffffffff;
  pIVar2 = LruHash<IPAsKeyLRU>::InsertOrAdd
                     (&this->table,this_00,false,(bool *)((long)&uStack_28 + 7));
  if (uStack_28._7_1_ == '\0') {
    (*(this_00->super_IPAsKey)._vptr_IPAsKey[1])(this_00);
  }
  if (pIVar2 == (IPAsKeyLRU *)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (pIVar2->super_IPAsKey).count;
  }
  return uVar1;
}

Assistant:

uint32_t AddressUseTracker::Check(uint8_t * addr, size_t len)
{
    IPAsKeyLRU * x = new IPAsKeyLRU(addr, len);
    uint32_t count = 1;

    while (table.GetCount() >= table_lru_max)
    {
        IPAsKeyLRU * removed = table.RemoveLRU();

        if (removed != NULL)
        {
            delete removed;
        }
    }

    if (x != NULL)
    {
        bool stored = false;

        IPAsKeyLRU * y = table.InsertOrAdd(x, false, &stored);

        if (!stored)
        {
            delete x;
        }

        if (y != NULL)
        {
            count = y->count;
        }
    }

    return count;
}